

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_types.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::numparse::impl::CompactUnicodeString<4>::toAliasedUnicodeString
          (UnicodeString *__return_storage_ptr__,CompactUnicodeString<4> *this)

{
  ConstChar16Ptr local_20 [3];
  
  local_20[0].p_ = (this->fBuffer).ptr;
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_20,-1);
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString toAliasedUnicodeString() const {
        return UnicodeString(TRUE, fBuffer.getAlias(), -1);
    }